

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseExternalID(xmlParserCtxtPtr ctxt,xmlChar **publicID,int strict)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  int iVar3;
  xmlChar *pxVar4;
  char *msg;
  
  *publicID = (xmlChar *)0x0;
  pxVar2 = ctxt->input;
  pxVar4 = pxVar2->cur;
  if (*pxVar4 == 'P') {
    if ((((pxVar4[1] != 'U') || (pxVar4[2] != 'B')) || (pxVar4[3] != 'L')) ||
       ((pxVar4[4] != 'I' || (pxVar4[5] != 'C')))) {
      return (xmlChar *)0x0;
    }
    pxVar2->cur = pxVar4 + 6;
    pxVar2->col = pxVar2->col + 6;
    if (pxVar4[6] == '\0') {
      xmlParserGrow(ctxt);
    }
    iVar3 = xmlSkipBlankChars(ctxt);
    if (iVar3 == 0) {
      xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after \'PUBLIC\'\n");
    }
    pxVar4 = xmlParsePubidLiteral(ctxt);
    *publicID = pxVar4;
    if (pxVar4 == (xmlChar *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_PUBID_REQUIRED,(char *)0x0);
    }
    iVar3 = xmlSkipBlankChars(ctxt);
    if (strict == 0) {
      if (iVar3 == 0) {
        return (xmlChar *)0x0;
      }
      xVar1 = *ctxt->input->cur;
      if ((xVar1 != '\'') && (xVar1 != '\"')) {
        return (xmlChar *)0x0;
      }
      goto LAB_00135ebd;
    }
    if (iVar3 != 0) goto LAB_00135ebd;
    msg = "Space required after the Public Identifier\n";
  }
  else {
    if (*pxVar4 != 'S') {
      return (xmlChar *)0x0;
    }
    if (pxVar4[1] != 'Y') {
      return (xmlChar *)0x0;
    }
    if (pxVar4[2] != 'S') {
      return (xmlChar *)0x0;
    }
    if (pxVar4[3] != 'T') {
      return (xmlChar *)0x0;
    }
    if (pxVar4[4] != 'E') {
      return (xmlChar *)0x0;
    }
    if (pxVar4[5] != 'M') {
      return (xmlChar *)0x0;
    }
    pxVar2->cur = pxVar4 + 6;
    pxVar2->col = pxVar2->col + 6;
    if (pxVar4[6] == '\0') {
      xmlParserGrow(ctxt);
    }
    iVar3 = xmlSkipBlankChars(ctxt);
    if (iVar3 != 0) goto LAB_00135ebd;
    msg = "Space required after \'SYSTEM\'\n";
  }
  xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,msg);
LAB_00135ebd:
  pxVar4 = xmlParseSystemLiteral(ctxt);
  if (pxVar4 == (xmlChar *)0x0) {
    xmlFatalErr(ctxt,XML_ERR_URI_REQUIRED,(char *)0x0);
    return (xmlChar *)0x0;
  }
  return pxVar4;
}

Assistant:

xmlChar *
xmlParseExternalID(xmlParserCtxtPtr ctxt, xmlChar **publicID, int strict) {
    xmlChar *URI = NULL;

    *publicID = NULL;
    if (CMP6(CUR_PTR, 'S', 'Y', 'S', 'T', 'E', 'M')) {
        SKIP(6);
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
	                   "Space required after 'SYSTEM'\n");
	}
	URI = xmlParseSystemLiteral(ctxt);
	if (URI == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_URI_REQUIRED, NULL);
        }
    } else if (CMP6(CUR_PTR, 'P', 'U', 'B', 'L', 'I', 'C')) {
        SKIP(6);
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		    "Space required after 'PUBLIC'\n");
	}
	*publicID = xmlParsePubidLiteral(ctxt);
	if (*publicID == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_PUBID_REQUIRED, NULL);
	}
	if (strict) {
	    /*
	     * We don't handle [83] so "S SystemLiteral" is required.
	     */
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			"Space required after the Public Identifier\n");
	    }
	} else {
	    /*
	     * We handle [83] so we return immediately, if
	     * "S SystemLiteral" is not detected. We skip blanks if no
             * system literal was found, but this is harmless since we must
             * be at the end of a NotationDecl.
	     */
	    if (SKIP_BLANKS == 0) return(NULL);
	    if ((CUR != '\'') && (CUR != '"')) return(NULL);
	}
	URI = xmlParseSystemLiteral(ctxt);
	if (URI == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_URI_REQUIRED, NULL);
        }
    }
    return(URI);
}